

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ServerList.cpp
# Opt level: O3

string * __thiscall
RenX_ServerListPlugin::server_as_json_abi_cxx11_
          (string *__return_storage_ptr__,RenX_ServerListPlugin *this,Server *server)

{
  size_type sVar1;
  _Alloc_hider _Var2;
  _Alloc_hider _Var3;
  _Alloc_hider _Var4;
  _Alloc_hider _Var5;
  _Alloc_hider _Var6;
  char cVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  undefined8 uVar11;
  size_t sVar12;
  undefined8 uVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  pointer pbVar21;
  char *pcVar22;
  char *pcVar23;
  RenX_ServerListPlugin *this_00;
  basic_string_view<char,_std::char_traits<char>_> *in_R8;
  char *pcVar24;
  char *pcVar25;
  undefined8 uVar26;
  string_view sVar27;
  string server_attributes;
  string server_prefix;
  string server_version;
  string server_map;
  string server_name;
  ListServerInfo serverInfo;
  undefined1 local_50 [16];
  undefined1 local_40 [16];
  
  getListServerInfo(&serverInfo,this,server);
  if (serverInfo.hostname._M_len == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    *(undefined4 *)&__return_storage_ptr__->field_2 = 0x6c6c756e;
    __return_storage_ptr__->_M_string_length = 4;
    (__return_storage_ptr__->field_2)._M_local_buf[4] = '\0';
  }
  else {
    sVar27 = (string_view)RenX::Server::getName();
    jsonify_abi_cxx11_(&server_name,sVar27);
    lVar10 = RenX::Server::getMap();
    sVar27._M_str = *(char **)(lVar10 + 0x10);
    sVar27._M_len = *(size_t *)(lVar10 + 0x18);
    jsonify_abi_cxx11_(&server_map,sVar27);
    sVar27 = (string_view)RenX::Server::getGameVersion();
    jsonify_abi_cxx11_(&server_version,sVar27);
    jsonify_abi_cxx11_(&server_prefix,serverInfo.namePrefix);
    if (server_prefix._M_string_length != 0) {
      local_40._0_8_ = 0xe;
      local_40._8_8_ = "\"NamePrefix\":\"";
      local_50._0_8_ = (pointer)0x2;
      local_50._8_8_ = "\",";
      jessilib::
      join<std::__cxx11::string,std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string&,std::basic_string_view<char,std::char_traits<char>>>
                (&server_attributes,(jessilib *)local_40,
                 (basic_string_view<char,_std::char_traits<char>_> *)&server_prefix,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,in_R8
                );
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&server_prefix,&server_attributes);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)server_attributes._M_dataplus._M_p != &server_attributes.field_2) {
        operator_delete(server_attributes._M_dataplus._M_p,
                        CONCAT71(server_attributes.field_2._M_allocated_capacity._1_7_,
                                 server_attributes.field_2._M_local_buf[0]) + 1);
      }
    }
    server_attributes._M_dataplus._M_p = (pointer)&server_attributes.field_2;
    server_attributes._M_string_length = 0;
    server_attributes.field_2._M_local_buf[0] = '\0';
    if (serverInfo.attributes.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        serverInfo.attributes.
        super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
                (&server_attributes,
                 (long)serverInfo.attributes.
                       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish +
                 (0x10 - (long)serverInfo.attributes.
                               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                (&server_attributes,0,server_attributes._M_string_length,"\"Attributes\":[",0xe);
      for (pbVar21 = serverInfo.attributes.
                     super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pbVar21 !=
          serverInfo.attributes.
          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish; pbVar21 = pbVar21 + 1) {
        sVar1 = pbVar21->_M_len;
        pcVar14 = pbVar21->_M_str;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&server_attributes,'\"');
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&server_attributes,pcVar14,sVar1);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&server_attributes,"\",");
      }
      server_attributes._M_dataplus._M_p[server_attributes._M_string_length - 1] = ']';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (&server_attributes,',');
    }
    _Var6._M_p = server_name._M_dataplus._M_p;
    _Var5._M_p = server_map._M_dataplus._M_p;
    _Var3._M_p = server_prefix._M_dataplus._M_p;
    this_00 = (RenX_ServerListPlugin *)server;
    uVar11 = RenX::Server::getBotCount();
    sVar12 = getListedPlayerCount(this_00,server);
    _Var4 = server_version._M_dataplus;
    sVar1 = server_attributes._M_string_length;
    _Var2 = server_attributes._M_dataplus;
    uVar13 = RenX::Server::getMineLimit();
    cVar7 = RenX::Server::isSteamRequired();
    pcVar22 = "false";
    pcVar14 = "false";
    if (cVar7 != '\0') {
      pcVar14 = "true";
    }
    cVar7 = RenX::Server::isPrivateMessageTeamOnly();
    pcVar15 = "false";
    if (cVar7 != '\0') {
      pcVar15 = "true";
    }
    cVar7 = RenX::Server::isPassworded();
    pcVar16 = "false";
    if (cVar7 != '\0') {
      pcVar16 = "true";
    }
    cVar7 = RenX::Server::isPrivateMessagingEnabled();
    pcVar23 = "false";
    if (cVar7 != '\0') {
      pcVar23 = "true";
    }
    cVar7 = RenX::Server::isRanked();
    pcVar25 = "false";
    if (cVar7 != '\0') {
      pcVar25 = "true";
    }
    uVar17 = RenX::Server::getGameType();
    uVar18 = RenX::Server::getPlayerLimit();
    uVar19 = RenX::Server::getVehicleLimit();
    iVar8 = RenX::Server::getTeamMode();
    pcVar24 = "false";
    if (iVar8 == 3) {
      pcVar24 = "true";
    }
    uVar20 = RenX::Server::getTeamMode();
    cVar7 = RenX::Server::isCratesEnabled();
    if (cVar7 != '\0') {
      pcVar22 = "true";
    }
    uVar26 = RenX::Server::getCrateRespawnDelay();
    uVar9 = RenX::Server::getTimeLimit();
    string_printf_abi_cxx11_
              (__return_storage_ptr__,
               "{\"Name\":\"%.*s\",%.*s\"Current Map\":\"%.*s\",\"Bots\":%u,\"Players\":%u,\"Game Version\":\"%.*s\",%.*s\"Variables\":{\"Mine Limit\":%d,\"bSteamRequired\":%s,\"bPrivateMessageTeamOnly\":%s,\"bPassworded\":%s,\"bAllowPrivateMessaging\":%s,\"bRanked\":%s,\"Game Type\":%d,\"Player Limit\":%d,\"Vehicle Limit\":%d,\"bAutoBalanceTeams\":%s,\"Team Mode\":%d,\"bSpawnCrates\":%s,\"CrateRespawnAfterPickup\":%f,\"Time Limit\":%d},\"Port\":%u,\"IP\":\"%.*s\""
               ,uVar26,server_name._M_string_length,_Var6._M_p,server_prefix._M_string_length,
               _Var3._M_p,server_map._M_string_length,_Var5._M_p,uVar11,sVar12,
               server_version._M_string_length,_Var4._M_p,sVar1,_Var2._M_p,uVar13,pcVar14,pcVar15,
               pcVar16,pcVar23,pcVar25,uVar17,uVar18,uVar19,pcVar24,uVar20,pcVar22,(ulong)uVar9,
               (ulong)serverInfo.port,serverInfo.hostname._M_len,serverInfo.hostname._M_str);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,'}');
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)server_attributes._M_dataplus._M_p != &server_attributes.field_2) {
      operator_delete(server_attributes._M_dataplus._M_p,
                      CONCAT71(server_attributes.field_2._M_allocated_capacity._1_7_,
                               server_attributes.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)server_prefix._M_dataplus._M_p != &server_prefix.field_2) {
      operator_delete(server_prefix._M_dataplus._M_p,server_prefix.field_2._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)server_version._M_dataplus._M_p != &server_version.field_2) {
      operator_delete(server_version._M_dataplus._M_p,
                      server_version.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)server_map._M_dataplus._M_p != &server_map.field_2) {
      operator_delete(server_map._M_dataplus._M_p,server_map.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)server_name._M_dataplus._M_p != &server_name.field_2) {
      operator_delete(server_name._M_dataplus._M_p,server_name.field_2._M_allocated_capacity + 1);
    }
  }
  if (serverInfo.attributes.
      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(serverInfo.attributes.
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)serverInfo.attributes.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)serverInfo.attributes.
                          super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string RenX_ServerListPlugin::server_as_json(const RenX::Server &server) {
	ListServerInfo serverInfo = getListServerInfo(server);

	if (serverInfo.hostname.empty()) {
		return "null"s;
	}

	std::string server_name = jsonify(server.getName());
	std::string server_map = jsonify(server.getMap().name);
	std::string server_version = jsonify(server.getGameVersion());
	std::string_view server_hostname = serverInfo.hostname;
	unsigned short server_port = serverInfo.port;
	std::string server_prefix = jsonify(serverInfo.namePrefix);

	// Some members we only include if they're populated
	if (!server_prefix.empty()) {
		server_prefix = jessilib::join<std::string>(R"json("NamePrefix":")json"sv, server_prefix, "\","sv);
	}

	std::string server_attributes;
	if (!serverInfo.attributes.empty()) {
		server_attributes.reserve(16 * serverInfo.attributes.size() + 16);
		server_attributes = R"json("Attributes":[)json";

		for (std::string_view attribute : serverInfo.attributes) {
			server_attributes += '\"';
			server_attributes += attribute;
			server_attributes += "\",";
		}

		server_attributes.back() = ']';
		server_attributes += ',';
	}

	// Build block
	std::string server_json_block = string_printf(R"json({"Name":"%.*s",%.*s"Current Map":"%.*s","Bots":%u,"Players":%u,"Game Version":"%.*s",%.*s"Variables":{"Mine Limit":%d,"bSteamRequired":%s,"bPrivateMessageTeamOnly":%s,"bPassworded":%s,"bAllowPrivateMessaging":%s,"bRanked":%s,"Game Type":%d,"Player Limit":%d,"Vehicle Limit":%d,"bAutoBalanceTeams":%s,"Team Mode":%d,"bSpawnCrates":%s,"CrateRespawnAfterPickup":%f,"Time Limit":%d},"Port":%u,"IP":"%.*s")json",
		server_name.size(), server_name.data(),
		server_prefix.size(), server_prefix.data(),
		server_map.size(), server_map.data(),
		server.getBotCount(),
		getListedPlayerCount(server),
		server_version.size(), server_version.data(),
		server_attributes.size(), server_attributes.data(),
		server.getMineLimit(),
		json_bool_as_cstring(server.isSteamRequired()),
		json_bool_as_cstring(server.isPrivateMessageTeamOnly()),
		json_bool_as_cstring(server.isPassworded()),
		json_bool_as_cstring(server.isPrivateMessagingEnabled()),
		json_bool_as_cstring(server.isRanked()),
		server.getGameType(),
		server.getPlayerLimit(),
		server.getVehicleLimit(),
		json_bool_as_cstring(server.getTeamMode() == 3),
		server.getTeamMode(),
		json_bool_as_cstring(server.isCratesEnabled()),
		server.getCrateRespawnDelay(),
		server.getTimeLimit(),
		server_port,
		server_hostname.size(), server_hostname.data());

	server_json_block += '}';

	return server_json_block;
}